

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ContentSpecNode::formatSpec(ContentSpecNode *this,XMLBuffer *bufToFill)

{
  XMLBuffer *bufToFill_local;
  ContentSpecNode *this_local;
  
  XMLBuffer::reset(bufToFill);
  if (this->fType == Leaf) {
    XMLBuffer::append(bufToFill,L'(');
  }
  formatNode(this,bufToFill,this->fMemoryManager);
  if (this->fType == Leaf) {
    XMLBuffer::append(bufToFill,L')');
  }
  return;
}

Assistant:

void ContentSpecNode::formatSpec(XMLBuffer&      bufToFill) const
{
    // Clean out the buffer first
    bufToFill.reset();

    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chOpenParen);
    formatNode
    (
        this
		, bufToFill
        , fMemoryManager
    );
    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chCloseParen);
}